

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

size_t Curl_is_absolute_url(char *url,char *buf,size_t buflen,_Bool guess_scheme)

{
  size_t sVar1;
  byte bVar2;
  char cVar3;
  long lVar4;
  size_t sVar5;
  
  if (buf != (char *)0x0) {
    *buf = '\0';
  }
  if ((byte)((*url & 0xdfU) + 0xbf) < 0x1a) {
    lVar4 = 2;
    while (((lVar4 != 0x29 && (bVar2 = url[lVar4 + -1], bVar2 != 0)) &&
           ((((byte)(bVar2 - 0x30) < 10 || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) ||
            ((bVar2 < 0x2f && ((0x680000000000U >> ((ulong)bVar2 & 0x3f) & 1) != 0))))))) {
      lVar4 = lVar4 + 1;
    }
    if (url[lVar4 + -1] == ':') {
      sVar1 = lVar4 - 1;
      sVar5 = 0;
      if (url[lVar4] == '/' || !guess_scheme) {
        sVar5 = sVar1;
      }
      if (buf == (char *)0x0) {
        return sVar5;
      }
      if (url[lVar4] != '/' && guess_scheme) {
        return sVar5;
      }
      cVar3 = '\0';
      sVar5 = sVar1;
      while( true ) {
        buf[sVar5] = cVar3;
        if (sVar5 == 0) break;
        cVar3 = Curl_raw_tolower(url[sVar5 - 1]);
        sVar5 = sVar5 - 1;
      }
      return sVar1;
    }
  }
  return 0;
}

Assistant:

size_t Curl_is_absolute_url(const char *url, char *buf, size_t buflen,
                            bool guess_scheme)
{
  int i = 0;
  DEBUGASSERT(!buf || (buflen > MAX_SCHEME_LEN));
  (void)buflen; /* only used in debug-builds */
  if(buf)
    buf[0] = 0; /* always leave a defined value in buf */
#ifdef _WIN32
  if(guess_scheme && STARTS_WITH_DRIVE_PREFIX(url))
    return 0;
#endif
  if(ISALPHA(url[0]))
    for(i = 1; i < MAX_SCHEME_LEN; ++i) {
      char s = url[i];
      if(s && (ISALNUM(s) || (s == '+') || (s == '-') || (s == '.') )) {
        /* RFC 3986 3.1 explains:
           scheme      = ALPHA *( ALPHA / DIGIT / "+" / "-" / "." )
        */
      }
      else {
        break;
      }
    }
  if(i && (url[i] == ':') && ((url[i + 1] == '/') || !guess_scheme)) {
    /* If this does not guess scheme, the scheme always ends with the colon so
       that this also detects data: URLs etc. In guessing mode, data: could
       be the host name "data" with a specified port number. */

    /* the length of the scheme is the name part only */
    size_t len = i;
    if(buf) {
      buf[i] = 0;
      while(i--) {
        buf[i] = Curl_raw_tolower(url[i]);
      }
    }
    return len;
  }
  return 0;
}